

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  size_t __size;
  bool bVar1;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *A;
  void *__ptr;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint i;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar8 = (ulong)N;
  __size = uVar8 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  A = (double *)malloc(__size);
  __ptr = malloc(__size);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar13 = l2norm(C,N);
  dVar14 = l2norm(C_00,N);
  if (eps < 0.0) {
    dVar15 = sqrt(eps);
  }
  else {
    dVar15 = SQRT(eps);
  }
  mmult(C_00,C,C_01,1,N,1);
  if (dVar14 * dVar13 * dVar15 <= *C_01) {
    uVar2 = 0;
    uVar12 = 0;
    if (0 < N) {
      uVar12 = (ulong)(uint)N;
    }
    uVar6 = (ulong)(uint)N;
    pdVar5 = H;
    pdVar4 = C;
    for (; uVar2 != uVar12; uVar2 = uVar2 + 1) {
      A[uVar2] = 0.0;
      dVar13 = 0.0;
      pdVar9 = pdVar5;
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        dVar13 = dVar13 + *pdVar9 * pdVar4[uVar11];
        A[uVar2] = dVar13;
        pdVar9 = pdVar9 + uVar8;
      }
      uVar6 = uVar6 - 1;
      pdVar4 = pdVar4 + 1;
      pdVar5 = pdVar5 + uVar8 + 1;
    }
    bVar1 = true;
    mmult(A,A,C_02,1,N,1);
    dVar13 = *C_01 / *C_02;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    lVar3 = 1;
    pdVar5 = H;
    for (uVar2 = 0; uVar2 != uVar12; uVar2 = uVar2 + 1) {
      dVar14 = 0.0;
      for (lVar10 = 0; lVar3 != lVar10; lVar10 = lVar10 + 1) {
        dVar14 = dVar14 + pdVar5[lVar10] * A[lVar10];
      }
      dVar16 = jac[uVar2];
      if (jac[uVar2] <= jacf[uVar2]) {
        dVar16 = jacf[uVar2];
      }
      if (dVar16 * dVar15 <= ABS(C_00[uVar2] - dVar14)) {
        bVar1 = false;
      }
      *(double *)((long)__ptr + uVar2 * 8) = dVar14 * -dVar13 + C_00[uVar2];
      lVar3 = lVar3 + 1;
      pdVar5 = pdVar5 + uVar8;
    }
    if (!bVar1) {
      dVar13 = *C_01 * *C_02;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        A[uVar2] = A[uVar2] * (1.0 / dVar13);
      }
      pdVar4 = H + uVar8;
      pdVar5 = H;
      for (lVar3 = 1; pdVar5 = pdVar5 + 1, lVar3 < (long)uVar8; lVar3 = lVar3 + 1) {
        pdVar9 = pdVar5;
        for (lVar10 = 0; lVar3 != lVar10; lVar10 = lVar10 + 1) {
          *pdVar9 = pdVar4[lVar10];
          pdVar9 = pdVar9 + uVar8;
        }
        pdVar4 = pdVar4 + uVar8;
      }
      iVar7 = N + 1;
      for (lVar3 = 1; uVar2 = uVar8, lVar3 < (long)uVar8; lVar3 = lVar3 + 1) {
        H[(long)iVar7 + -1] = 0.0;
        iVar7 = iVar7 + N + 1;
      }
      do {
        uVar6 = uVar2 - 1;
        if (((long)uVar2 < 2) || (lVar3 = uVar2 - 1, A[lVar3] != 0.0)) break;
        uVar2 = uVar6;
      } while (!NAN(A[lVar3]));
      i = (uint)uVar6;
      while (i = i - 1, -1 < (int)i) {
        jrotate(H,N,A[i],-A[(ulong)i + 1],i);
        dVar13 = A[i];
        dVar14 = A[(ulong)i + 1];
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          dVar14 = SQRT(dVar13 * dVar13 + dVar14 * dVar14);
        }
        else {
          dVar14 = ABS(dVar14);
        }
        A[i] = dVar14;
      }
      for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        H[uVar2] = *A * *(double *)((long)__ptr + uVar2 * 8) + H[uVar2];
      }
      uVar2 = 0;
      uVar12 = uVar6 & 0xffffffff;
      if ((int)(uint)uVar6 < 1) {
        uVar12 = uVar2;
      }
      pdVar5 = H;
      iVar7 = N;
      for (; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        jrotate(H,N,*pdVar5,-H[iVar7],(int)uVar2);
        iVar7 = iVar7 + N + 1;
        pdVar5 = pdVar5 + uVar8 + 1;
      }
      pdVar5 = H + uVar8;
      for (lVar3 = 1; H = H + 1, lVar3 < (long)uVar8; lVar3 = lVar3 + 1) {
        pdVar4 = H;
        for (lVar10 = 0; lVar3 != lVar10; lVar10 = lVar10 + 1) {
          pdVar5[lVar10] = *pdVar4;
          pdVar4 = pdVar4 + uVar8;
        }
        pdVar5 = pdVar5 + uVar8;
      }
    }
  }
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(A);
  free(__ptr);
  return;
}

Assistant:

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm,alpha,temp3;
	double *sk,*yk,*temp,*temp2,*t,*u;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	u = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = i; j < N;++j) {
				ct = j * N;
				t[i] += H[ct + i] * sk[j];
			}
		}
		mmult(t,t,temp2,1,N,1);
		alpha = sqrt(temp[0]/temp2[0]);
		supd = 1;
		for(i = 0; i < N;++i) {
			temp3 = 0.0;
			ct = i * N;
			for(j = 0; j < i+1;++j) {
				temp3 += H[ct + j] * t[j];
			}
			yt = fabs(yk[i] - temp3);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
			u[i] = yk[i] - alpha*temp3;
		}
		if (supd == 0) {
			temp3 = 1.0 / sqrt(temp[0] * temp2[0]);
			for(i = 0; i < N; ++i) {
				t[i] *= temp3;
			}
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[j*N+i] = H[ct+j];
				}
			}
			qrupdate(H,N,t,u);
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[ct+j] = H[j*N+i];
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
	free(u);
}